

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch2.hpp
# Opt level: O0

void __thiscall
Catch::CumulativeReporterBase<Catch::JunitReporter>::sectionStarting
          (CumulativeReporterBase<Catch::JunitReporter> *this,SectionInfo *sectionInfo)

{
  bool bVar1;
  __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  reference psVar2;
  undefined1 local_120 [40];
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  local_f8;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  local_f0;
  __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
  it;
  SectionNode *parentNode;
  undefined1 local_d0 [24];
  shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> node;
  undefined1 local_98 [8];
  SectionStats incompleteStats;
  SectionInfo *sectionInfo_local;
  CumulativeReporterBase<Catch::JunitReporter> *this_local;
  
  incompleteStats._120_8_ = sectionInfo;
  memset(&node.
          super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount,0,0x18);
  Counts::Counts((Counts *)
                 &node.
                  super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
  SectionStats::SectionStats
            ((SectionStats *)local_98,sectionInfo,
             (Counts *)
             &node.
              super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,0.0,false);
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
             (local_d0 + 0x10));
  bVar1 = clara::std::
          vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
          ::empty(&this->m_sectionStack);
  if (bVar1) {
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->m_rootSection);
    if (!bVar1) {
      std::
      make_shared<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,Catch::SectionStats&>
                ((SectionStats *)local_d0);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      operator=(&this->m_rootSection,
                (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                local_d0);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      ~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                  local_d0);
    }
    clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
    operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              (local_d0 + 0x10),&this->m_rootSection);
  }
  else {
    this_00 = (__shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)clara::std::
                 vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                 ::back(&this->m_sectionStack);
    it._M_current =
         (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
         clara::std::
         __shared_ptr_access<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator*(this_00);
    local_f8._M_current =
         (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
         clara::std::
         vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
         ::begin(&((element_type *)it._M_current)->childSections);
    local_120._32_8_ =
         clara::std::
         vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
         ::end((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                *)&it._M_current[8].
                   super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
    BySectionInfo::BySectionInfo
              ((BySectionInfo *)(local_120 + 0x18),(SectionInfo *)incompleteStats._120_8_);
    local_f0 = std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>*,std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>>>>,Catch::CumulativeReporterBase<Catch::JunitReporter>::BySectionInfo>
                         (local_f8,(__normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                                    )local_120._32_8_,(BySectionInfo *)(local_120 + 0x18));
    local_120._16_8_ =
         clara::std::
         vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
         ::end((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                *)&it._M_current[8].
                   super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
    bVar1 = __gnu_cxx::operator==
                      (&local_f0,
                       (__normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
                        *)(local_120 + 0x10));
    if (bVar1) {
      std::
      make_shared<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,Catch::SectionStats&>
                ((SectionStats *)local_120);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                (local_d0 + 0x10),
                (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                local_120);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      ~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                  local_120);
      clara::std::
      vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
      ::push_back((vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
                   *)&it._M_current[8].
                      super___shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount,
                  (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                  (local_d0 + 0x10));
    }
    else {
      psVar2 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>
               ::operator*(&local_f0);
      clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
      operator=((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
                (local_d0 + 0x10),psVar2);
    }
  }
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>
  ::push_back(&this->m_sectionStack,(value_type *)(local_d0 + 0x10));
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  operator=(&this->m_deepestSection,
            (shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
            (local_d0 + 0x10));
  clara::std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>::
  ~shared_ptr((shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode> *)
              (local_d0 + 0x10));
  SectionStats::~SectionStats((SectionStats *)local_98);
  return;
}

Assistant:

void sectionStarting( SectionInfo const& sectionInfo ) override {
            SectionStats incompleteStats( sectionInfo, Counts(), 0, false );
            std::shared_ptr<SectionNode> node;
            if( m_sectionStack.empty() ) {
                if( !m_rootSection )
                    m_rootSection = std::make_shared<SectionNode>( incompleteStats );
                node = m_rootSection;
            }
            else {
                SectionNode& parentNode = *m_sectionStack.back();
                auto it =
                    std::find_if(   parentNode.childSections.begin(),
                                    parentNode.childSections.end(),
                                    BySectionInfo( sectionInfo ) );
                if( it == parentNode.childSections.end() ) {
                    node = std::make_shared<SectionNode>( incompleteStats );
                    parentNode.childSections.push_back( node );
                }
                else
                    node = *it;
            }
            m_sectionStack.push_back( node );
            m_deepestSection = std::move(node);
        }